

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap(MessageGenerator *this,Printer *p)

{
  byte bVar1;
  OneofDescriptor *pOVar2;
  pointer ppFVar3;
  FieldDescriptor *pFVar4;
  unsigned_long uVar5;
  long *plVar6;
  ushort *puVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  FileOptions_OptimizeMode FVar11;
  CppStringType CVar12;
  int iVar13;
  value_type this_00;
  pointer ppFVar14;
  pointer prVar15;
  FieldGenerator *this_01;
  value_type pOVar16;
  Nonnull<const_char_*> failure_msg;
  undefined1 split;
  int iVar17;
  Options *in_RCX;
  FieldGeneratorTable *pFVar18;
  ulong uVar19;
  long lVar20;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Formatter format;
  string last_field_name;
  FieldDescriptor *field;
  string first_field_name;
  Iterator __begin3;
  const_iterator it;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Iterator __begin4;
  anon_class_1_0_00000001 local_2b9;
  Formatter local_2b8;
  Printer *local_290;
  Options *local_288;
  undefined1 local_280 [32];
  FileDescriptor *local_260;
  undefined1 local_258 [32];
  undefined1 local_238 [8];
  Descriptor *local_230;
  iterator local_218;
  string local_208;
  undefined1 local_1e8 [32];
  unsigned_long local_1c8;
  FieldGeneratorTable *local_1c0;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_1b8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [168];
  Sub local_e8;
  
  local_288 = &this->options_;
  local_290 = p;
  SimpleBaseClass_abi_cxx11_
            ((string *)local_1a0,(cpp *)this->descriptor_,(Descriptor *)local_288,in_RCX);
  uVar8 = local_1a0._8_8_;
  if ((undefined1 *)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_,(ulong)(local_190._0_8_ + 1));
  }
  if ((slot_type *)uVar8 != (slot_type *)0x0) {
    return;
  }
  local_2b8.printer_ = local_290;
  local_2b8.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_2b8.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_2b8.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  format_00._M_str =
       "void $classname$::InternalSwap($classname$* PROTOBUF_RESTRICT $nonnull$ other) {\n";
  format_00._M_len = 0x51;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (local_290,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&local_2b8.vars_,format_00);
  (local_2b8.printer_)->indent_ =
       (local_2b8.printer_)->indent_ + ((local_2b8.printer_)->options_).spaces_per_indent;
  format_01._M_str = "using ::std::swap;\n";
  format_01._M_len = 0x13;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (local_2b8.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&local_2b8.vars_,format_01);
  format_02._M_str = "$WeakDescriptorSelfPin$";
  format_02._M_len = 0x17;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (local_2b8.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&local_2b8.vars_,format_02);
  FVar11 = GetOptimizeFor(this->descriptor_->file_,local_288,(bool *)0x0);
  if (FVar11 == FileOptions_OptimizeMode_CODE_SIZE) {
    format_03._M_str = "GetReflection()->Swap(this, other);";
    format_03._M_len = 0x23;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (local_2b8.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&local_2b8.vars_,format_03);
    goto LAB_00db3c03;
  }
  local_258._8_8_ = this->descriptor_;
  if (0 < *(int *)(local_258._8_8_ + 0x90)) {
    format_04._M_str = "$extensions$.InternalSwap(&other->$extensions$);\n";
    format_04._M_len = 0x31;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (local_2b8.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&local_2b8.vars_,format_04);
    local_258._8_8_ = this->descriptor_;
  }
  local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
  local_258._0_4_ = *(int *)(local_258._8_8_ + 8);
  local_230 = (Descriptor *)local_258._8_8_;
  bVar9 = protobuf::internal::operator==((Iterator *)local_238,(Iterator *)local_258);
  if (!bVar9) {
    do {
      this_00 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::
                operator*((Iterator *)local_238);
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4) == 9) &&
         ((CVar12 = FieldDescriptor::cpp_string_type(this_00), CVar12 == kString ||
          (CVar12 = FieldDescriptor::cpp_string_type(this_00), CVar12 == kView)))) {
        bVar1 = this_00->field_0x1;
        bVar9 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 != bVar9) {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar9,0xbf < bVar1,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,failure_msg);
LAB_00db3cbd:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_1a0);
        }
        if ((bVar1 & 0x20) == 0) {
          if ((this_00->field_0x3 & 1) == 0) {
            bVar9 = ShouldSplit(this_00,local_288);
            if (!bVar9) {
              io::Printer::Emit(local_290,0,0,0x5b,
                                "\n        auto* arena = GetArena();\n        ABSL_DCHECK_EQ(arena, other->GetArena());\n      "
                               );
              break;
            }
          }
          else {
            if ((bVar1 & 0x10) == 0) {
              iVar13 = 0xb63;
LAB_00db3cdb:
              protobuf::internal::protobuf_assumption_failed
                        ("res != nullptr",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,iVar13);
            }
            pOVar2 = (this_00->scope_).containing_oneof;
            if (pOVar2 == (OneofDescriptor *)0x0) {
              iVar13 = 0xb31;
              goto LAB_00db3cdb;
            }
            if ((pOVar2->field_count_ == 1) && ((pOVar2->fields_->field_0x1 & 2) != 0)) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_1a0,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb64,"!res->is_synthetic()");
              goto LAB_00db3cbd;
            }
          }
        }
      }
      local_238._0_4_ = local_238._0_4_ + 1;
      bVar9 = protobuf::internal::operator==((Iterator *)local_238,(Iterator *)local_258);
    } while (!bVar9);
  }
  format_05._M_str = "_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n";
  format_05._M_len = 0x3f;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (local_2b8.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&local_2b8.vars_,format_05);
  if (((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (local_1a0._0_8_ = (pointer)0x0, 0x3e < this->max_has_bit_index_ + 0x3eU)) {
    do {
      Formatter::operator()
                (&local_2b8,"swap($has_bits$[$1$], other->$has_bits$[$1$]);\n",
                 (unsigned_long *)local_1a0);
      local_1a0._0_8_ = local_1a0._0_8_ + 1;
      iVar13 = this->max_has_bit_index_ + 0x1f;
      iVar17 = this->max_has_bit_index_ + 0x3e;
      if (-1 < iVar13) {
        iVar17 = iVar13;
      }
    } while ((ulong)local_1a0._0_8_ < (pointer)(long)(iVar17 >> 5));
  }
  local_1a0._8_8_ =
       (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        )0x0;
  local_190._8_8_ =
       std::
       _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc:3826:36)>
       ::_M_invoke;
  local_190._0_8_ =
       std::
       _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc:3826:36)>
       ::_M_manager;
  ppFVar14 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_238 = (undefined1  [8])0x1;
  local_230 = (Descriptor *)0x0;
  local_280._0_8_ = (FieldDescriptor *)0x0;
  local_1a0._0_8_ = this;
  if (ppFVar14 == ppFVar3) {
LAB_00db370f:
    (*(code *)local_190._0_8_)(local_1a0,local_1a0,3);
  }
  else {
    do {
      pFVar4 = *ppFVar14;
      local_258._0_8_ = pFVar4;
      if ((code *)local_190._0_8_ == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      cVar10 = (*(code *)local_190._8_8_)
                         (local_1a0,
                          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>::iterator,_bool>
                           *)local_258);
      if (cVar10 == '\0') {
        local_280._0_8_ = (FieldDescriptor *)0x0;
      }
      else {
        if ((FieldDescriptor *)local_280._0_8_ == (FieldDescriptor *)0x0) {
          local_280._0_8_ = pFVar4;
        }
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>>
        ::try_emplace_impl<google::protobuf::FieldDescriptor_const*const&>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>::iterator,_bool>
                    *)local_258,local_238,(FieldDescriptor **)local_280);
        *(long *)(local_258._8_8_ + 8) = *(long *)(local_258._8_8_ + 8) + 1;
      }
      ppFVar14 = ppFVar14 + 1;
    } while (ppFVar14 != ppFVar3);
    if ((code *)local_190._0_8_ != (code *)0x0) goto LAB_00db370f;
  }
  ppFVar14 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar14) {
    pFVar18 = &this->field_generators_;
    uVar19 = 0;
    local_1c0 = pFVar18;
    do {
      split = SUB81(pFVar18,0);
      local_260 = (FileDescriptor *)ppFVar14[uVar19];
      bVar9 = ShouldSplit((FieldDescriptor *)local_260,local_288);
      if (!bVar9) {
        local_218 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>>
                    ::find<google::protobuf::FieldDescriptor_const*>
                              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>>
                                *)local_238,
                               (key_arg<const_google::protobuf::FieldDescriptor_*> *)&local_260);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                    *)local_238);
        local_1a0._0_8_ = (MessageGenerator *)0x0;
        bVar9 = absl::lts_20250127::container_internal::operator==(&local_218,(iterator *)local_1a0)
        ;
        if ((bVar9) ||
           (prVar15 = absl::lts_20250127::container_internal::
                      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                      ::iterator::operator->(&local_218), prVar15->second < 2)) {
          this_01 = FieldGeneratorTable::get(local_1c0,(FieldDescriptor *)local_260);
          FieldGenerator::GenerateSwappingCode(this_01,local_290);
        }
        else {
          prVar15 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                    ::iterator::operator->(&local_218);
          uVar5 = prVar15->second;
          FieldMemberName_abi_cxx11_
                    ((string *)local_258,(cpp *)local_260,(FieldDescriptor *)0x0,(bool)split);
          local_1c8 = uVar5;
          FieldMemberName_abi_cxx11_
                    ((string *)local_280,
                     (cpp *)(this->optimized_order_).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar19 + (uVar5 - 1)],
                     (FieldDescriptor *)0x0,(bool)split);
          local_1e8._0_8_ = local_1e8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"first","");
          io::Printer::Sub::Sub<std::__cxx11::string_const&>
                    ((Sub *)local_1a0,(string *)local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258)
          ;
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"last","");
          io::Printer::Sub::Sub<std::__cxx11::string_const&>
                    (&local_e8,&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280)
          ;
          vars.len_ = 2;
          vars.ptr_ = (Sub *)local_1a0;
          io::Printer::WithDefs(&local_1b8,local_290,vars,false);
          lVar20 = 0x170;
          do {
            if (local_1b8.storage_.callback_buffer_[lVar20 + 8] == '\x01') {
              std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
              _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                         (local_1e8 + lVar20));
            }
            plVar6 = *(long **)((long)&local_218.field_1 + lVar20);
            if ((long *)(local_1e8 + lVar20 + -0x18) != plVar6) {
              operator_delete(plVar6,*(long *)(local_1e8 + lVar20 + -0x18) + 1);
            }
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
              ::_S_vtable._M_arr[*(byte *)((long)&local_218.ctrl_ + lVar20)]._M_data)
                      (&local_2b9,
                       (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                        *)(local_238 + lVar20));
            *(undefined1 *)((long)&local_218.ctrl_ + lVar20) = 0xff;
            if ((long *)(local_258 + lVar20 + 0x10) != *(long **)(local_258 + lVar20)) {
              operator_delete(*(long **)(local_258 + lVar20),
                              *(long *)(local_258 + lVar20 + 0x10) + 1);
            }
            lVar20 = lVar20 + -0xb8;
          } while (lVar20 != 0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          format_06._M_str =
               "$pbi$::memswap<\n    PROTOBUF_FIELD_OFFSET($classname$, $last$)\n    + sizeof($classname$::$last$)\n    - PROTOBUF_FIELD_OFFSET($classname$, $first$)>(\n        reinterpret_cast<char*>(&$first$),\n        reinterpret_cast<char*>(&other->$first$));\n"
          ;
          format_06._M_len = 0xf3;
          io::Printer::
          FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                    (local_2b8.printer_,
                     (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )ZEXT816(0),&local_2b8.vars_,format_06);
          absl::lts_20250127::
          Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
          ::~Cleanup(&local_1b8);
          if ((FieldDescriptor *)local_280._0_8_ != (FieldDescriptor *)(local_280 + 0x10)) {
            operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
          }
          if ((FieldDescriptor *)local_258._0_8_ != (FieldDescriptor *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          uVar19 = uVar19 + (local_1c8 - 1);
        }
      }
      uVar19 = uVar19 + 1;
      ppFVar14 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pFVar18 = (FieldGeneratorTable *)
                ((long)(this->optimized_order_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar14 >> 3);
    } while (uVar19 < pFVar18);
  }
  bVar9 = ShouldSplit(this->descriptor_,local_288);
  if (bVar9) {
    format_07._M_str = "swap($split$, other->$split$);\n";
    format_07._M_len = 0x1f;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (local_2b8.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&local_2b8.vars_,format_07);
  }
  local_258._8_8_ = this->descriptor_;
  local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffff00000000;
  local_258._0_4_ = *(int *)(local_258._8_8_ + 0x84);
  local_1a0._8_8_ = local_258._8_8_;
  while (bVar9 = cpp::operator==((Iterator *)local_1a0,(Iterator *)local_258), !bVar9) {
    pOVar16 = OneOfRangeImpl::Iterator::operator*((Iterator *)local_1a0);
    puVar7 = (ushort *)(pOVar16->all_names_).payload_;
    local_280._0_8_ = ZEXT28(*puVar7);
    local_280._8_8_ = (long)puVar7 + ~local_280._0_8_;
    Formatter::operator()
              (&local_2b8,"swap(_impl_.$1$_, other->_impl_.$1$_);\n",
               (basic_string_view<char,_std::char_traits<char>_> *)local_280);
    local_1a0._0_4_ = local_1a0._0_4_ + 1;
  }
  local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffff00000000;
  if (0 < this->descriptor_->real_oneof_decl_count_) {
    do {
      Formatter::operator()
                (&local_2b8,"swap($oneof_case$[$1$], other->$oneof_case$[$1$]);\n",(int *)local_1a0)
      ;
      iVar13 = local_1a0._0_4_ + 1;
      local_1a0._0_4_ = iVar13;
    } while (iVar13 < this->descriptor_->real_oneof_decl_count_);
  }
  if (this->num_weak_fields_ != 0) {
    format_08._M_str = "$weak_field_map$.UnsafeArenaSwap(&other->$weak_field_map$);\n";
    format_08._M_len = 0x3c;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (local_2b8.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&local_2b8.vars_,format_08);
  }
  if (((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (local_1a0._0_8_ = (pointer)0x0, 0x3e < this->max_inlined_string_index_ + 0x3eU)) {
    do {
      Formatter::operator()
                (&local_2b8,
                 "swap($inlined_string_donated_array$[$1$], other->$inlined_string_donated_array$[$1$]);\n"
                 ,(unsigned_long *)local_1a0);
      local_1a0._0_8_ = local_1a0._0_8_ + 1;
      iVar13 = this->max_inlined_string_index_ + 0x1f;
      iVar17 = this->max_inlined_string_index_ + 0x3e;
      if (-1 < iVar13) {
        iVar17 = iVar13;
      }
    } while ((ulong)local_1a0._0_8_ < (pointer)(long)(iVar17 >> 5));
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                     *)local_238);
LAB_00db3c03:
  io::Printer::Outdent(local_2b8.printer_);
  format_09._M_str = "}\n";
  format_09._M_len = 2;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (local_2b8.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&local_2b8.vars_,format_09);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_2b8.vars_);
  return;
}

Assistant:

void MessageGenerator::GenerateSwap(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(p);

  format(
      "void $classname$::InternalSwap($classname$* PROTOBUF_RESTRICT "
      "$nonnull$ other) {\n");
  format.Indent();
  format("using ::std::swap;\n");
  format("$WeakDescriptorSelfPin$");

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    if (descriptor_->extension_range_count() > 0) {
      format(
          "$extensions$.InternalSwap(&other->$extensions$);"
          "\n");
    }

    if (HasNonSplitOptionalString(descriptor_, options_)) {
      p->Emit(R"cc(
        auto* arena = GetArena();
        ABSL_DCHECK_EQ(arena, other->GetArena());
      )cc");
    }
    format("_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");

    if (!has_bit_indices_.empty()) {
      for (size_t i = 0; i < HasBitsSize(); ++i) {
        format("swap($has_bits$[$1$], other->$has_bits$[$1$]);\n", i);
      }
    }

    // If possible, we swap several fields at once, including padding.
    const RunMap runs =
        FindRuns(optimized_order_, [this](const FieldDescriptor* field) {
          return !ShouldSplit(field, options_) &&
                 HasTrivialSwap(field, options_, scc_analyzer_);
        });

    for (size_t i = 0; i < optimized_order_.size(); ++i) {
      const FieldDescriptor* field = optimized_order_[i];
      if (ShouldSplit(field, options_)) {
        continue;
      }
      const auto it = runs.find(field);

      // We only apply the memswap technique to runs of more than one field, as
      // `swap(field_, other.field_)` is better than
      // `memswap<...>(&field_, &other.field_)` for generated code readability.
      if (it != runs.end() && it->second > 1) {
        // Use a memswap, then skip run_length fields.
        const size_t run_length = it->second;
        const std::string first_field_name =
            FieldMemberName(field, /*split=*/false);
        const std::string last_field_name = FieldMemberName(
            optimized_order_[i + run_length - 1], /*split=*/false);

        auto v = p->WithVars({
            {"first", first_field_name},
            {"last", last_field_name},
        });

        format(
            "$pbi$::memswap<\n"
            "    PROTOBUF_FIELD_OFFSET($classname$, $last$)\n"
            "    + sizeof($classname$::$last$)\n"
            "    - PROTOBUF_FIELD_OFFSET($classname$, $first$)>(\n"
            "        reinterpret_cast<char*>(&$first$),\n"
            "        reinterpret_cast<char*>(&other->$first$));\n");

        i += run_length - 1;
        // ++i at the top of the loop.
      } else {
        field_generators_.get(field).GenerateSwappingCode(p);
      }
    }
    if (ShouldSplit(descriptor_, options_)) {
      format("swap($split$, other->$split$);\n");
    }

    for (auto oneof : OneOfRange(descriptor_)) {
      format("swap(_impl_.$1$_, other->_impl_.$1$_);\n", oneof->name());
    }

    for (int i = 0; i < descriptor_->real_oneof_decl_count(); ++i) {
      format("swap($oneof_case$[$1$], other->$oneof_case$[$1$]);\n", i);
    }

    if (num_weak_fields_) {
      format(
          "$weak_field_map$.UnsafeArenaSwap(&other->$weak_field_map$)"
          ";\n");
    }

    if (!inlined_string_indices_.empty()) {
      for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
        format(
            "swap($inlined_string_donated_array$[$1$], "
            "other->$inlined_string_donated_array$[$1$]);\n",
            i);
      }
    }
  } else {
    format("GetReflection()->Swap(this, other);");
  }

  format.Outdent();
  format("}\n");
}